

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

MessageFederate * getMessageFed(HelicsFederate fed,HelicsError *err)

{
  int *piVar1;
  MessageFederate *pMVar2;
  bool bVar3;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fed == (HelicsFederate)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019fd12;
    }
    else {
      bVar3 = *(int *)((long)fed + 8) == 0x2352188;
      piVar1 = (int *)0x0;
      if (bVar3) {
        piVar1 = (int *)fed;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019fd14;
    }
    err->error_code = -3;
    err->message = "federate object is not valid";
  }
LAB_0019fd12:
  piVar1 = (int *)0x0;
LAB_0019fd14:
  if (piVar1 != (int *)0x0) {
    if (*piVar1 - 2U < 3) {
      if (*(long *)(piVar1 + 4) == 0) {
        pMVar2 = (MessageFederate *)0x0;
      }
      else {
        pMVar2 = (MessageFederate *)
                 __dynamic_cast(*(long *)(piVar1 + 4),&helics::Federate::typeinfo,
                                &helics::MessageFederate::typeinfo,0xffffffffffffffff);
      }
      if (err == (HelicsError *)0x0) {
        return pMVar2;
      }
      if (pMVar2 != (MessageFederate *)0x0) {
        return pMVar2;
      }
    }
    else if (err == (HelicsError *)0x0) {
      return (MessageFederate *)0x0;
    }
    err->error_code = -3;
    err->message = "Federate must be a message federate";
  }
  return (MessageFederate *)0x0;
}

Assistant:

helics::MessageFederate* getMessageFed(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::MESSAGE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto* rval = dynamic_cast<helics::MessageFederate*>(fedObj->fedptr.get());
        if (rval != nullptr) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notMessageFedString);
    return nullptr;
}